

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O3

integer ieeeck_(integer *ispec,real *zero,real *one)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined4 in_ECX;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  
  fVar1 = *one;
  fVar2 = *zero;
  if ((((fVar1 < fVar1 / fVar2) && (-fVar1 / fVar2 < fVar2)) &&
      (fVar6 = fVar1 / (-fVar1 / fVar2 + fVar1), fVar6 == fVar2)) && (fVar1 / fVar6 < fVar2)) {
    fVar9 = fVar2 + fVar6;
    if (((fVar9 == fVar2) && (!NAN(fVar9) && !NAN(fVar2))) &&
       ((fVar9 = fVar1 / fVar9, fVar1 < fVar9 &&
        ((fVar5 = (fVar1 / fVar6) * fVar9, fVar5 < fVar2 && (fVar9 = fVar9 * fVar9, fVar1 < fVar9)))
        ))) {
      if (*ispec == 0) {
        return 1;
      }
      auVar7._4_4_ = fVar9;
      auVar7._0_4_ = fVar9;
      auVar7._8_4_ = fVar2;
      auVar7._12_4_ = fVar6;
      auVar8._4_4_ = fVar9;
      auVar8._0_4_ = fVar5;
      auVar8._8_8_ = 0;
      auVar8 = divps(auVar7,auVar8);
      auVar3._4_4_ = -(uint)!NAN(auVar8._4_4_);
      auVar3._0_4_ = -(uint)!NAN(auVar8._0_4_);
      auVar3._8_4_ = -(uint)!NAN(fVar9 * fVar2);
      auVar3._12_4_ = -(uint)!NAN(fVar5 * fVar6);
      iVar4 = movmskps(in_ECX,auVar3);
      if ((iVar4 == 0) && (NAN(fVar9 + fVar5))) {
        return (integer)NAN(fVar5 * fVar6 * 0.0);
      }
    }
  }
  return 0;
}

Assistant:

integer ieeeck_(integer *ispec, real *zero, real *one)
{
    /* System generated locals */
    integer ret_val;

    /* Local variables */
    static real nan1, nan2, nan3, nan4, nan5, nan6, neginf, posinf, negzro,
	    newzro;


/*
    -- LAPACK auxiliary routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       June 30, 1998


    Purpose
    =======

    IEEECK is called from the ILAENV to verify that Infinity and
    possibly NaN arithmetic is safe (i.e. will not trap).

    Arguments
    =========

    ISPEC   (input) INTEGER
            Specifies whether to test just for inifinity arithmetic
            or whether to test for infinity and NaN arithmetic.
            = 0: Verify infinity arithmetic only.
            = 1: Verify infinity and NaN arithmetic.

    ZERO    (input) REAL
            Must contain the value 0.0
            This is passed to prevent the compiler from optimizing
            away this code.

    ONE     (input) REAL
            Must contain the value 1.0
            This is passed to prevent the compiler from optimizing
            away this code.

    RETURN VALUE:  INTEGER
            = 0:  Arithmetic failed to produce the correct answers
            = 1:  Arithmetic produced the correct answers
*/

    ret_val = 1;

    posinf = *one / *zero;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }

    neginf = -(*one) / *zero;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    negzro = *one / (neginf + *one);
    if (negzro != *zero) {
	ret_val = 0;
	return ret_val;
    }

    neginf = *one / negzro;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    newzro = negzro + *zero;
    if (newzro != *zero) {
	ret_val = 0;
	return ret_val;
    }

    posinf = *one / newzro;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }

    neginf *= posinf;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    posinf *= posinf;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }


/*     Return if we were only asked to check infinity arithmetic */

    if (*ispec == 0) {
	return ret_val;
    }

    nan1 = posinf + neginf;

    nan2 = posinf / neginf;

    nan3 = posinf / posinf;

    nan4 = posinf * *zero;

    nan5 = neginf * negzro;

    nan6 = nan5 * 0.f;

    if (nan1 == nan1) {
	ret_val = 0;
	return ret_val;
    }

    if (nan2 == nan2) {
	ret_val = 0;
	return ret_val;
    }

    if (nan3 == nan3) {
	ret_val = 0;
	return ret_val;
    }

    if (nan4 == nan4) {
	ret_val = 0;
	return ret_val;
    }

    if (nan5 == nan5) {
	ret_val = 0;
	return ret_val;
    }

    if (nan6 == nan6) {
	ret_val = 0;
	return ret_val;
    }

    return ret_val;
}